

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

void __thiscall
testing::internal::CartesianProductGenerator<void_(*)(int_*,_int,_int),_BLOCK_SIZE,_int>::
IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL>_>::ComputeCurrentValue
          (IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL>_> *this)

{
  bool bVar1;
  shared_ptr<std::tuple<void_(*)(int_*,_int,_int),_BLOCK_SIZE,_int>_> *this_00;
  int *in_RDI;
  anon_enum_8 *unaff_retaddr;
  _func_void_int_ptr_int_int **in_stack_00000008;
  IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL>_> *in_stack_00000010;
  shared_ptr<std::tuple<void_(*)(int_*,_int,_int),_BLOCK_SIZE,_int>_> *in_stack_ffffffffffffffc8;
  
  bVar1 = AtEnd(in_stack_00000010);
  if (!bVar1) {
    std::
    get<0ul,testing::internal::ParamIterator<void(*)(int*,int,int)>,testing::internal::ParamIterator<BLOCK_SIZE>,testing::internal::ParamIterator<int>>
              ((tuple<testing::internal::ParamIterator<void_(*)(int_*,_int,_int)>,_testing::internal::ParamIterator<BLOCK_SIZE>,_testing::internal::ParamIterator<int>_>
                *)0xa0941e);
    this_00 = (shared_ptr<std::tuple<void_(*)(int_*,_int,_int),_BLOCK_SIZE,_int>_> *)
              ParamIterator<void_(*)(int_*,_int,_int)>::operator*
                        ((ParamIterator<void_(*)(int_*,_int,_int)> *)0xa09426);
    std::
    get<1ul,testing::internal::ParamIterator<void(*)(int*,int,int)>,testing::internal::ParamIterator<BLOCK_SIZE>,testing::internal::ParamIterator<int>>
              ((tuple<testing::internal::ParamIterator<void_(*)(int_*,_int,_int)>,_testing::internal::ParamIterator<BLOCK_SIZE>,_testing::internal::ParamIterator<int>_>
                *)0xa09439);
    ParamIterator<BLOCK_SIZE>::operator*((ParamIterator<BLOCK_SIZE> *)0xa09441);
    std::
    get<2ul,testing::internal::ParamIterator<void(*)(int*,int,int)>,testing::internal::ParamIterator<BLOCK_SIZE>,testing::internal::ParamIterator<int>>
              ((tuple<testing::internal::ParamIterator<void_(*)(int_*,_int,_int)>,_testing::internal::ParamIterator<BLOCK_SIZE>,_testing::internal::ParamIterator<int>_>
                *)0xa09454);
    ParamIterator<int>::operator*((ParamIterator<int> *)0xa0945c);
    std::
    make_shared<std::tuple<void(*)(int*,int,int),BLOCK_SIZE,int>,void(*const&)(int*,int,int),BLOCK_SIZE_const&,int_const&>
              (in_stack_00000008,unaff_retaddr,in_RDI);
    std::shared_ptr<std::tuple<void_(*)(int_*,_int,_int),_BLOCK_SIZE,_int>_>::operator=
              (this_00,in_stack_ffffffffffffffc8);
    std::shared_ptr<std::tuple<void_(*)(int_*,_int,_int),_BLOCK_SIZE,_int>_>::~shared_ptr
              ((shared_ptr<std::tuple<void_(*)(int_*,_int,_int),_BLOCK_SIZE,_int>_> *)0xa09490);
  }
  return;
}

Assistant:

void ComputeCurrentValue() {
      if (!AtEnd())
        current_value_ = std::make_shared<ParamType>(*std::get<I>(current_)...);
    }